

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter.h
# Opt level: O0

Context __thiscall
mp::
FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
::
RunConversion<mp::CustomFunctionalConstraint<std::array<int,1ul>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::AbsId>>
          (FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
           *this,CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AbsId>
                 *con,int i,int depth)

{
  bool bVar1;
  int in_ECX;
  BasicConstraintKeeper *in_RSI;
  MIPFlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_RDI;
  NodeRange NVar2;
  AutoLinkScope<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  auto_link_scope;
  AutoLinkScope<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_stack_00000090;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  BasicConstraintKeeper *in_stack_ffffffffffffffa0;
  AutoLinkScope<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_stack_ffffffffffffffb0;
  ValueNode *in_stack_ffffffffffffffb8;
  Context local_28;
  Context local_24 [3];
  BasicConstraintKeeper *local_18;
  CtxVal local_4;
  
  (in_RDI->
  super_FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  ).constr_depth_ = in_ECX + 1;
  local_18 = in_RSI;
  bVar1 = FunctionalConstraint::UsesContext();
  if (bVar1) {
    local_24[0] = FunctionalConstraint::GetContext((FunctionalConstraint *)local_18);
    bVar1 = Context::IsNone(local_24);
    if (bVar1) {
      Context::Context(&local_28,CTX_MIX);
      FunctionalConstraint::SetContext((FunctionalConstraint *)local_18,local_28);
      in_stack_ffffffffffffffa0 = local_18;
    }
  }
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  ::GetConstraintKeeper
            (&in_RDI->
              super_FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
             ,(AbsConstraint *)0x0);
  NVar2 = BasicConstraintKeeper::SelectValueNodeRange
                    (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
  NVar2.ir_ = (NodeIndexRange)NVar2.pvn_;
  NVar2.pvn_ = in_stack_ffffffffffffffb8;
  pre::
  AutoLinkScope<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::AutoLinkScope(in_stack_ffffffffffffffb0,
                  (FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                   *)in_RDI,NVar2);
  local_4 = (CtxVal)MIPFlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                    ::Convert(in_RDI,(ItemType *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c
                             );
  pre::
  AutoLinkScope<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::~AutoLinkScope(in_stack_00000090);
  return (Context)local_4;
}

Assistant:

Context RunConversion(const Constraint& con, int i, int depth) {
    assert(
        !GET_CONSTRAINT_KEEPER(Constraint).IsRedundant(i));
    constr_depth_ = depth+1;
    if (con.UsesContext())              // If context relevant,
      if (con.GetContext().IsNone())    // ensure we have context, mixed if none
        con.SetContext(Context::CTX_MIX);
    pre::AutoLinkScope<Impl> auto_link_scope{
      *static_cast<Impl*>(this),
      GET_CONSTRAINT_KEEPER(Constraint).SelectValueNodeRange(i)
    };
    return MP_DISPATCH(Convert(con, i));
  }